

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

Vec_Int_t * Gia_GenCollectFlopIndexes(char *pStr,int nLutNum,int nLutSize,int nFlops)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  char *__nptr;
  uint *__ptr;
  void *__dest;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  uVar8 = nLutNum * nLutSize;
  if (nFlops < (int)uVar8) {
    __assert_fail("nLutSize * nLutNum <= nFlops",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x4a,"Vec_Int_t *Gia_GenCollectFlopIndexes(char *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar8 - 1) {
    uVar2 = uVar8;
  }
  p->nSize = 0;
  p->nCap = uVar2;
  if (pStr == (char *)0x0) {
    if (uVar2 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar2 << 2);
    }
    p->pArray = piVar3;
    p->nSize = uVar8;
    if (0 < (int)uVar8) {
      uVar5 = 0;
      do {
        piVar3[uVar5] = (int)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
  }
  else {
    if (uVar2 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar2 << 2);
    }
    p->pArray = piVar3;
    __nptr = strtok(pStr,", ");
    while (__nptr != (char *)0x0) {
      uVar2 = atoi(__nptr);
      if (nFlops <= (int)uVar2) {
        printf("Flop index (%d) exceeds the number of flops (%d).\n",(ulong)uVar2,
               (ulong)(uint)nFlops);
        break;
      }
      Vec_IntPush(p,uVar2);
      __nptr = strtok((char *)0x0,", ");
    }
    uVar2 = p->nSize;
    if (uVar2 == uVar8) {
      lVar6 = (long)(int)uVar2;
      __ptr = (uint *)malloc(0x10);
      __ptr[1] = uVar2;
      *__ptr = uVar2;
      if (uVar2 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(lVar6 * 4);
      }
      *(void **)(__ptr + 2) = __dest;
      piVar3 = p->pArray;
      memcpy(__dest,piVar3,lVar6 * 4);
      if (1 < (int)uVar2) {
        qsort(__dest,(ulong)uVar2,4,Vec_IntSortCompare1);
        uVar8 = 1;
        lVar4 = 1;
        do {
          iVar1 = *(int *)((long)__dest + lVar4 * 4);
          if (iVar1 != *(int *)((long)__dest + lVar4 * 4 + -4)) {
            lVar7 = (long)(int)uVar8;
            uVar8 = uVar8 + 1;
            *(int *)((long)__dest + lVar7 * 4) = iVar1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar6 != lVar4);
        __ptr[1] = uVar8;
      }
      uVar8 = __ptr[1];
      if (__dest != (void *)0x0) {
        free(__dest);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      if (uVar2 - uVar8 == 0) {
        return p;
      }
      printf("Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n",
             (ulong)(uVar2 - uVar8));
    }
    else {
      printf("Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n",(ulong)uVar8,
             (ulong)uVar2);
      piVar3 = p->pArray;
    }
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->pArray = (int *)0x0;
    }
    free(p);
    p = (Vec_Int_t *)0x0;
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_GenCollectFlopIndexes( char * pStr, int nLutNum, int nLutSize, int nFlops )
{
    int nDups;
    char * pTemp;
    Vec_Int_t * vFlops;
    assert( nLutSize * nLutNum <= nFlops );
    if ( pStr == NULL )
        return Vec_IntStartNatural( nLutNum * nLutSize );
    vFlops = Vec_IntAlloc( nLutNum * nLutSize );
    pTemp = strtok( pStr, ", " );
    while ( pTemp )
    {
        int iFlop = atoi(pTemp);
        if ( iFlop >= nFlops )
        {
            printf( "Flop index (%d) exceeds the number of flops (%d).\n", iFlop, nFlops );
            break;
        }
        Vec_IntPush( vFlops, iFlop );
        pTemp = strtok( NULL, ", " );
    }
    if ( Vec_IntSize(vFlops) != nLutNum * nLutSize )
    {
        printf( "Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n", nLutNum * nLutSize, Vec_IntSize(vFlops) );
        Vec_IntFree( vFlops );
        return NULL;
    }
    nDups = Vec_IntCountDuplicates(vFlops);
    if ( nDups )
    {
        printf( "Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n", nDups );
        Vec_IntFree( vFlops );
        return NULL;
    }
    return vFlops;
}